

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O2

void __thiscall QtMWidgets::MessageBoxPrivate::adjustSize(MessageBoxPrivate *this)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  QSize QVar5;
  QSize QVar6;
  undefined8 uVar7;
  int width;
  uint uVar8;
  double dVar9;
  QRect QVar10;
  QSize s;
  QPoint p;
  const_iterator local_48;
  const_iterator local_40;
  
  QGuiApplication::primaryScreen();
  QVar5 = (QSize)QScreen::availableSize();
  QVar6 = QWidget::size((QWidget *)this->q);
  QGuiApplication::primaryScreen();
  uVar7 = QScreen::availableGeometry();
  iVar4 = QVar6.ht;
  if (this->window != (QWidget *)0x0) {
    QVar5 = QWidget::size(this->window);
    QVar10 = QWidget::rect(this->window);
    uVar7 = QVar10._0_8_;
  }
  QtPrivate::QForeachContainer<QList<QAbstractButton_*>_>::QForeachContainer
            ((QForeachContainer<QList<QAbstractButton_*>_> *)&p,&this->buttons);
  uVar8 = 0;
  for (; local_48.i != local_40.i; local_48.i = local_48.i + 1) {
    iVar3 = (**(code **)(*(long *)*local_48.i + 0x70))();
    uVar8 = uVar8 + iVar3;
  }
  QArrayDataPointer<QAbstractButton_*>::~QArrayDataPointer
            ((QArrayDataPointer<QAbstractButton_*> *)&p);
  s = QVar6;
  if (QVar6.wd < (int)uVar8) {
    iVar4 = (**(code **)(*(long *)this->textLabel + 0x80))(this->textLabel,uVar8);
    lVar1 = *(long *)&this->title->field_0x20;
    lVar2 = *(long *)&this->okButton->field_0x20;
    iVar4 = ((iVar4 + *(int *)(lVar1 + 0x20) + *(int *)(lVar2 + 0x20) +
              *(int *)(*(long *)(this->h1 + 0x20) + 0x20) +
             *(int *)(*(long *)(this->h2 + 0x20) + 0x20)) -
            (*(int *)(lVar1 + 0x18) + *(int *)(lVar2 + 0x18) +
             *(int *)(*(long *)(this->h1 + 0x20) + 0x18) +
            *(int *)(*(long *)(this->h2 + 0x20) + 0x18))) + 4;
    s.ht = iVar4;
    s.wd = uVar8;
    QVar6.ht = 0;
    QVar6.wd = uVar8;
  }
  dVar9 = (double)iVar4 / (double)QVar6.wd;
  if (1.5 < dVar9) {
    dVar9 = dVar9 * (double)QVar6.wd;
    QVar6.wd = (uint)((double)((ulong)dVar9 & 0x8000000000000000 | (ulong)DAT_00186080) + dVar9);
    QVar6.ht = 0;
    iVar4 = (**(code **)(*(long *)this->textLabel + 0x80))(this->textLabel,QVar6.wd);
    lVar1 = *(long *)&this->title->field_0x20;
    lVar2 = *(long *)&this->okButton->field_0x20;
    iVar4 = ((iVar4 + *(int *)(lVar1 + 0x20) + *(int *)(lVar2 + 0x20) +
              *(int *)(*(long *)(this->h1 + 0x20) + 0x20) +
             *(int *)(*(long *)(this->h2 + 0x20) + 0x20)) -
            (*(int *)(lVar1 + 0x18) + *(int *)(lVar2 + 0x18) +
             *(int *)(*(long *)(this->h1 + 0x20) + 0x18) +
            *(int *)(*(long *)(this->h2 + 0x20) + 0x18))) + 4;
    s.ht = iVar4;
    s.wd = QVar6.wd;
  }
  iVar3 = this->screenMargin;
  uVar8 = QVar5.wd + iVar3 * -2;
  if ((int)uVar8 < QVar6.wd) {
    iVar4 = (**(code **)(*(long *)this->textLabel + 0x80))(this->textLabel,uVar8);
    lVar1 = *(long *)&this->title->field_0x20;
    lVar2 = *(long *)&this->okButton->field_0x20;
    iVar4 = ((iVar4 + *(int *)(lVar1 + 0x20) + *(int *)(lVar2 + 0x20) +
              *(int *)(*(long *)(this->h1 + 0x20) + 0x20) +
             *(int *)(*(long *)(this->h2 + 0x20) + 0x20)) -
            (*(int *)(lVar1 + 0x18) + *(int *)(lVar2 + 0x18) +
             *(int *)(*(long *)(this->h1 + 0x20) + 0x18) +
            *(int *)(*(long *)(this->h2 + 0x20) + 0x18))) + 4;
    s.ht = iVar4;
    s.wd = uVar8;
    iVar3 = this->screenMargin;
    QVar6.ht = 0;
    QVar6.wd = uVar8;
  }
  uVar8 = QVar5.ht + iVar3 * -2;
  if ((int)uVar8 < iVar4) {
    s = (QSize)((ulong)QVar6 & 0xffffffff | (ulong)uVar8 << 0x20);
  }
  QWidget::resize((QSize *)this->q);
  p.yp = (QVar5.ht - s.ht) / 2 + (int)((ulong)uVar7 >> 0x20);
  p.xp = (QVar5.wd - s.wd) / 2 + (int)uVar7;
  if ((QPoint *)this->window != (QPoint *)0x0) {
    p = (QPoint)QWidget::mapToGlobal((QPoint *)this->window);
  }
  QWidget::move((QPoint *)this->q);
  QLayout::update();
  return;
}

Assistant:

void
MessageBoxPrivate::adjustSize()
{
	QSize ws = QApplication::primaryScreen()->availableSize();
	QSize s = q->size();
	QRect wr = QApplication::primaryScreen()->availableGeometry();

	if( window )
	{
		ws = window->size();
		wr = window->rect();
	}

	{
		int width = 0;

		foreach( QAbstractButton * btn, buttons )
			width += btn->sizeHint().width();

		if( width > s.width() )
			s = QSize( width,
					textLabel->heightForWidth( width ) + title->height() +
						okButton->height() + h1->height() + h2->height() );
	}

	qreal factor = (qreal) s.height() / (qreal) s.width();

	if( factor > 1.5 )
	{
		const int width = qRound( (qreal) s.width() * factor );

		s = QSize( width,
				textLabel->heightForWidth( width ) + title->height() +
					okButton->height() + h1->height() + h2->height() );
	}

	if( s.width() > ws.width() - screenMargin * 2 )
	{
		const int width = ws.width() - screenMargin * 2;

		s = QSize( width,
			textLabel->heightForWidth( width ) + title->height() +
				okButton->height() + h1->height() + h2->height() );
	}

	if( s.height() > ws.height() - screenMargin * 2 )
		s = QSize( s.width(), ws.height() - screenMargin * 2 );


	q->resize( s );

	QPoint p = QPoint( wr.x() + ( ws.width() - s.width() ) / 2,
		wr.y() + ( ws.height() - s.height() ) / 2 );

	if( window )
		p = window->mapToGlobal( p );

	q->move( p );

	vbox->update();
}